

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O0

void UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  UBool useFallback_00;
  byte bVar1;
  UChar *sourceLimit;
  void *pvVar2;
  UConverterSharedData *sharedData_00;
  bool bVar3;
  UChar *source;
  UBool UVar4;
  int iVar5;
  UChar *pUVar6;
  uint8_t trailByte;
  int trailIsOk;
  int leadIsOk;
  UBool useFallback;
  UConverterSharedData *sharedData;
  UConverterDataISO2022 *myData;
  UChar mySourceChar;
  UChar32 targetUniChar;
  char *mySourceLimit;
  UChar *myTarget;
  char *mySource;
  UErrorCode *pUStack_18;
  char tempBuf [2];
  UErrorCode *err_local;
  UConverterToUnicodeArgs *args_local;
  
  myTarget = (UChar *)args->source;
  mySourceLimit = (char *)args->target;
  sourceLimit = (UChar *)args->sourceLimit;
  pvVar2 = args->converter->extraInfo;
  pUStack_18 = err;
  if (*(int *)((long)pvVar2 + 0x6c) == 1) {
    UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
  }
  else {
    sharedData_00 = *(UConverterSharedData **)(*(long *)((long)pvVar2 + 0x50) + 0x30);
    useFallback_00 = args->converter->useFallback;
    if (*(int *)((long)pvVar2 + 0x68) == 0) {
      if (args->converter->toULength != '\x01') goto LAB_004244a8;
      if (sourceLimit <= myTarget) goto LAB_004244a8;
      if (args->targetLimit <= mySourceLimit) goto LAB_004244a8;
      myData._2_2_ = (ushort)args->converter->toUBytes[0];
      args->converter->toULength = '\0';
      goto LAB_00424613;
    }
LAB_0042458f:
    *(undefined1 *)((long)pvVar2 + 0x70) = 0;
    changeState_2022(args->converter,(char **)&myTarget,(char *)sourceLimit,ISO_2022_KR,pUStack_18);
    UVar4 = U_FAILURE(*pUStack_18);
    if (UVar4 == '\0') {
LAB_004244a8:
      do {
        source = myTarget;
        if (sourceLimit <= myTarget) {
LAB_004247f4:
          args->target = (UChar *)mySourceLimit;
          args->source = (char *)myTarget;
          return;
        }
        if (args->targetLimit <= mySourceLimit) {
          *pUStack_18 = U_BUFFER_OVERFLOW_ERROR;
          goto LAB_004247f4;
        }
        pUVar6 = (UChar *)((long)myTarget + 1);
        bVar1 = (byte)*myTarget;
        myData._2_2_ = (ushort)bVar1;
        if (myData._2_2_ == 0xf) {
          *(undefined1 *)((long)pvVar2 + 0x60) = 0;
          myTarget = pUVar6;
          if (*(char *)((long)pvVar2 + 0x70) != '\0') {
            *(undefined1 *)((long)pvVar2 + 0x70) = 0;
            *pUStack_18 = U_ILLEGAL_ESCAPE_SEQUENCE;
            args->converter->toUCallbackReason = UCNV_IRREGULAR;
            args->converter->toUBytes[0] = bVar1;
            args->converter->toULength = '\x01';
            args->target = (UChar *)mySourceLimit;
            args->source = (char *)pUVar6;
            return;
          }
          goto LAB_004244a8;
        }
        if (myData._2_2_ != 0xe) {
          if (myData._2_2_ != 0x1b) {
            *(undefined1 *)((long)pvVar2 + 0x70) = 0;
            if (*(char *)((long)pvVar2 + 0x60) == '\x01') {
              myTarget = pUVar6;
              if (sourceLimit <= pUVar6) {
                args->converter->toUBytes[0] = bVar1;
                args->converter->toULength = '\x01';
                goto LAB_004247f4;
              }
LAB_00424613:
              myData._4_4_ = 0xffff;
              bVar1 = (byte)*myTarget;
              bVar3 = 0x5d < (byte)(bVar1 - 0x21);
              if ((0x5d < (myData._2_2_ - 0x21 & 0xff)) || (bVar3)) {
                if ((bVar3) && ((0x1f < bVar1 || ((1 << (bVar1 & 0x1f) & 0x800c000U) == 0)))) {
                  myTarget = (UChar *)((long)myTarget + 1);
                  myData._2_2_ = myData._2_2_ << 8 | (ushort)bVar1;
                }
              }
              else {
                myTarget = (UChar *)((long)myTarget + 1);
                mySource._6_1_ = (char)myData._2_2_ + -0x80;
                mySource._7_1_ = bVar1 + 0x80;
                myData._4_4_ = ucnv_MBCSSimpleGetNextUChar_63
                                         (sharedData_00,(char *)((long)&mySource + 6),2,
                                          useFallback_00);
                myData._2_2_ = myData._2_2_ << 8 | (ushort)bVar1;
              }
            }
            else if (myData._2_2_ < 0x80) {
              myTarget = pUVar6;
              myData._4_4_ = ucnv_MBCSSimpleGetNextUChar_63
                                       (sharedData_00,(char *)source,1,useFallback_00);
            }
            else {
              myData._4_4_ = 0xffff;
              myTarget = pUVar6;
            }
            if (0xfffd < (int)myData._4_4_) {
              toUnicodeCallback(args->converter,(uint)myData._2_2_,myData._4_4_,pUStack_18);
              goto LAB_004247f4;
            }
            if (args->offsets != (int32_t *)0x0) {
              iVar5 = 2;
              if (myData._2_2_ < 0x100) {
                iVar5 = 1;
              }
              args->offsets[(long)mySourceLimit - (long)args->target >> 1] =
                   ((int)myTarget - (int)args->source) - iVar5;
            }
            *(short *)mySourceLimit = (short)myData._4_4_;
            mySourceLimit = mySourceLimit + 2;
            goto LAB_004244a8;
          }
          goto LAB_0042458f;
        }
        *(undefined1 *)((long)pvVar2 + 0x60) = 1;
        *(undefined1 *)((long)pvVar2 + 0x70) = 1;
        myTarget = pUVar6;
      } while( true );
    }
    args->target = (UChar *)mySourceLimit;
    args->source = (char *)myTarget;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                                            UErrorCode* err){
    char tempBuf[2];
    const char *mySource = ( char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    UChar32 targetUniChar = 0x0000;
    UChar mySourceChar = 0x0000;
    UConverterDataISO2022* myData;
    UConverterSharedData* sharedData ;
    UBool useFallback;

    myData=(UConverterDataISO2022*)(args->converter->extraInfo);
    if(myData->version==1){
        UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
        return;
    }

    /* initialize state */
    sharedData = myData->currentConverter->sharedData;
    useFallback = args->converter->useFallback;

    if(myData->key != 0) {
        /* continue with a partial escape sequence */
        goto escape;
    } else if(args->converter->toULength == 1 && mySource < mySourceLimit && myTarget < args->targetLimit) {
        /* continue with a partial double-byte character */
        mySourceChar = args->converter->toUBytes[0];
        args->converter->toULength = 0;
        goto getTrailByte;
    }

    while(mySource< mySourceLimit){

        if(myTarget < args->targetLimit){

            mySourceChar= (unsigned char) *mySource++;

            if(mySourceChar==UCNV_SI){
                myData->toU2022State.g = 0;
                if (myData->isEmptySegment) {
                    myData->isEmptySegment = FALSE;	/* we are handling it, reset to avoid future spurious errors */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUCallbackReason = UCNV_IRREGULAR;
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength = 1;
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                /*consume the source */
                continue;
            }else if(mySourceChar==UCNV_SO){
                myData->toU2022State.g = 1;
                myData->isEmptySegment = TRUE;	/* Begin a new segment, empty so far */
                /*consume the source */
                continue;
            }else if(mySourceChar==ESC_2022){
                mySource--;
escape:
                myData->isEmptySegment = FALSE;	/* Any invalid ESC sequences will be detected separately, so just reset this */
                changeState_2022(args->converter,&(mySource),
                                mySourceLimit, ISO_2022_KR, err);
                if(U_FAILURE(*err)){
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                continue;
            }

            myData->isEmptySegment = FALSE;	/* Any invalid char errors will be detected separately, so just reset this */
            if(myData->toU2022State.g == 1) {
                if(mySource < mySourceLimit) {
                    int leadIsOk, trailIsOk;
                    uint8_t trailByte;
getTrailByte:
                    targetUniChar = missingCharMarker;
                    trailByte = (uint8_t)*mySource;
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     *
                     * In ISO-2022 DBCS, if the second byte is in the 21..7e range or is
                     * an ESC/SO/SI, we report only the first byte as the illegal sequence.
                     * Otherwise we convert or report the pair of bytes.
                     */
                    leadIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                    trailIsOk = (uint8_t)(trailByte - 0x21) <= (0x7e - 0x21);
                    if (leadIsOk && trailIsOk) {
                        ++mySource;
                        tempBuf[0] = (char)(mySourceChar + 0x80);
                        tempBuf[1] = (char)(trailByte + 0x80);
                        targetUniChar = ucnv_MBCSSimpleGetNextUChar(sharedData, tempBuf, 2, useFallback);
                        mySourceChar = (mySourceChar << 8) | trailByte;
                    } else if (!(trailIsOk || IS_2022_CONTROL(trailByte))) {
                        /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                        ++mySource;
                        /* add another bit so that the code below writes 2 bytes in case of error */
                        mySourceChar = static_cast<UChar>(0x10000 | (mySourceChar << 8) | trailByte);
                    }
                } else {
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength = 1;
                    break;
                }
            }
            else if(mySourceChar <= 0x7f) {
                targetUniChar = ucnv_MBCSSimpleGetNextUChar(sharedData, mySource - 1, 1, useFallback);
            } else {
                targetUniChar = 0xffff;
            }
            if(targetUniChar < 0xfffe){
                if(args->offsets) {
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                *(myTarget++)=(UChar)targetUniChar;
            }
            else {
                /* Call the callback function*/
                toUnicodeCallback(args->converter,mySourceChar,targetUniChar,err);
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
    args->target = myTarget;
    args->source = mySource;
}